

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::Base64Test_decodeTest_Test::TestBody(Base64Test_decodeTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_80;
  Message local_78 [3];
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  string decoded;
  TestVector *test_case;
  TestVector *__end2;
  TestVector *__begin2;
  TestVector (*__range2) [18];
  Base64Test_decodeTest_Test *this_local;
  
  for (__end2 = (TestVector *)(anonymous_namespace)::testVector;
      __end2 != (TestVector *)&(anonymous_namespace)::Base64Test_encodeTest_Test::test_info_;
      __end2 = __end2 + 1) {
    detail::base64_decode((detail *)&gtest_ar.message_,&__end2->encoded);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_60,"test_case.decoded","decoded",&__end2->decoded,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(local_78);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/util/tests/unit/base64_test.cc"
                 ,0x3d,message);
      testing::internal::AssertHelper::operator=(&local_80,local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      testing::Message::~Message(local_78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(Base64Test, decodeTest) {
  for (const auto& test_case : testVector) {
    std::string decoded = detail::base64_decode(test_case.encoded);
    EXPECT_EQ(test_case.decoded, decoded);
  }
}